

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

int portability_path_compare(char *left_path,char *right_path)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  size_t right_length;
  size_t left_length;
  size_t local_28;
  size_t local_20;
  uint local_4;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = 1;
  }
  else {
    local_20 = strlen(in_RDI);
    local_28 = strlen(in_RSI);
    if ((local_20 == 0) || (local_28 == 0)) {
      local_4 = 1;
    }
    else {
      if (in_RDI[local_20 - 1] == '/') {
        local_20 = local_20 - 1;
      }
      if (in_RSI[local_28 - 1] == '/') {
        local_28 = local_28 - 1;
      }
      if (local_20 == local_28) {
        iVar1 = strncmp(in_RDI,in_RSI,local_20);
        local_4 = (uint)(iVar1 != 0);
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int portability_path_compare(const char *left_path, const char *right_path)
{
	if (left_path == NULL || right_path == NULL)
	{
		return 1;
	}

	size_t left_length = strlen(left_path);
	size_t right_length = strlen(right_path);

	if (left_length == 0 || right_length == 0)
	{
		return 1;
	}

	if (PORTABILITY_PATH_SEPARATOR(left_path[left_length - 1]))
	{
		--left_length;
	}

	if (PORTABILITY_PATH_SEPARATOR(right_path[right_length - 1]))
	{
		--right_length;
	}

	if (left_length != right_length)
	{
		return 1;
	}

	return (strncmp(left_path, right_path, left_length) != 0);
}